

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O3

void __thiscall beast::unit_test::runner::~runner(runner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_runner = (_func_int **)&PTR__runner_002d24a0;
  pcVar2 = (this->arg_)._M_dataplus._M_p;
  paVar1 = &(this->arg_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

virtual ~runner() = default;